

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::FindFileByName
          (SimpleDescriptorDatabase *this,string *filename,FileDescriptorProto *output)

{
  bool bVar1;
  SimpleDescriptorDatabase *in_RDX;
  FileDescriptorProto *in_RDI;
  FileDescriptorProto *in_stack_ffffffffffffffd8;
  
  DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::FindFile
            ((DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *)in_RDI,
             (string *)in_stack_ffffffffffffffd8);
  bVar1 = MaybeCopy(in_RDX,in_RDI,in_stack_ffffffffffffffd8);
  return bVar1;
}

Assistant:

bool SimpleDescriptorDatabase::FindFileByName(const std::string& filename,
                                              FileDescriptorProto* output) {
  return MaybeCopy(index_.FindFile(filename), output);
}